

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapStringField<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  bool bVar1;
  CppStringType CVar2;
  Cord *__a;
  Cord *__b;
  MicroString *this;
  MicroString *other;
  Arena *rhs_arena;
  Arena *lhs_arena;
  MicroString *rhs_string;
  MicroString *lhs_string;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  CVar2 = FieldDescriptor::cpp_string_type(field);
  if (CVar2 != kView) {
    if (CVar2 == kCord) {
      __a = Reflection::MutableRaw<absl::lts_20250127::Cord>(r,lhs,field);
      __b = Reflection::MutableRaw<absl::lts_20250127::Cord>(r,rhs,field);
      std::swap<absl::lts_20250127::Cord>(__a,__b);
      return;
    }
    if (CVar2 != kString) {
      return;
    }
  }
  bVar1 = Reflection::IsInlined(r,field);
  if (bVar1) {
    SwapInlinedStrings<true>(r,lhs,rhs,field);
  }
  else {
    bVar1 = Reflection::IsMicroString(r,field);
    if (bVar1) {
      this = Reflection::MutableRaw<google::protobuf::internal::MicroString>(r,lhs,field);
      other = Reflection::MutableRaw<google::protobuf::internal::MicroString>(r,rhs,field);
      MessageLite::GetArena(&lhs->super_MessageLite);
      MessageLite::GetArena(&rhs->super_MessageLite);
      MicroString::InternalSwap(this,other,7);
    }
    else {
      SwapNonInlinedStrings<true>(r,lhs,rhs,field);
    }
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapStringField(const Reflection* r, Message* lhs,
                                      Message* rhs,
                                      const FieldDescriptor* field) {
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord:
      // Always shallow swap for Cord.
      std::swap(*r->MutableRaw<absl::Cord>(lhs, field),
                *r->MutableRaw<absl::Cord>(rhs, field));
      break;
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString: {
      if (r->IsInlined(field)) {
        SwapFieldHelper::SwapInlinedStrings<unsafe_shallow_swap>(r, lhs, rhs,
                                                                 field);
      } else if (r->IsMicroString(field)) {
        auto* lhs_string = r->MutableRaw<MicroString>(lhs, field);
        auto* rhs_string = r->MutableRaw<MicroString>(rhs, field);
        auto* lhs_arena = lhs->GetArena();
        auto* rhs_arena = rhs->GetArena();
        if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
          lhs_string->InternalSwap(rhs_string);
        } else {
          MicroString tmp;
          tmp.Set(*lhs_string, rhs_arena);
          lhs_string->Set(*rhs_string, lhs_arena);
          if (rhs_arena == nullptr) rhs_string->Destroy();
          *rhs_string = tmp;
        }
      } else {
        SwapFieldHelper::SwapNonInlinedStrings<unsafe_shallow_swap>(r, lhs, rhs,
                                                                    field);
      }
      break;
    }
  }
}